

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void bloaty::BloatyDoMain(Options *options,InputFileFactory *file_factory,RollupOutput *output)

{
  Rep *pRVar1;
  string *psVar2;
  long lVar3;
  int iVar4;
  char *str;
  long lVar5;
  void **ppvVar6;
  string_view function;
  Bloaty bloaty;
  ReImpl re;
  
  Bloaty::Bloaty(&bloaty,file_factory,options);
  lVar5 = (long)(options->filename_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar5 == 0) {
    iVar4 = 0x8ea;
    str = "must specify at least one file";
  }
  else {
    if (0 < options->max_rows_per_level_) {
      pRVar1 = (options->filename_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      for (lVar3 = 0; lVar5 * 8 != lVar3; lVar3 = lVar3 + 8) {
        Bloaty::AddFilename(&bloaty,*(string **)((long)ppvVar6 + lVar3),false);
      }
      pRVar1 = (options->base_filename_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar4 = (options->base_filename_).super_RepeatedPtrFieldBase.current_size_;
      for (lVar5 = 0; (long)iVar4 * 8 != lVar5; lVar5 = lVar5 + 8) {
        Bloaty::AddFilename(&bloaty,*(string **)((long)ppvVar6 + lVar5),true);
      }
      pRVar1 = (options->debug_filename_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar4 = (options->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
      for (lVar5 = 0; (long)iVar4 * 8 != lVar5; lVar5 = lVar5 + 8) {
        Bloaty::AddDebugFilename(&bloaty,*(string **)((long)ppvVar6 + lVar5));
      }
      pRVar1 = (options->source_map_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar4 = (options->source_map_).super_RepeatedPtrFieldBase.current_size_;
      for (lVar5 = 0; (long)iVar4 * 8 != lVar5; lVar5 = lVar5 + 8) {
        Bloaty::AddSourceMapFilename(&bloaty,*(string **)((long)ppvVar6 + lVar5));
      }
      pRVar1 = (options->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar4 = (options->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
      for (lVar5 = 0; (long)iVar4 * 8 != lVar5; lVar5 = lVar5 + 8) {
        Bloaty::DefineCustomDataSource(&bloaty,*(CustomDataSource **)((long)ppvVar6 + lVar5));
      }
      pRVar1 = (options->data_source_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      iVar4 = (options->data_source_).super_RepeatedPtrFieldBase.current_size_;
      for (lVar5 = 0; (long)iVar4 * 8 != lVar5; lVar5 = lVar5 + 8) {
        Bloaty::AddDataSource(&bloaty,*(string **)((long)ppvVar6 + lVar5));
      }
      if (((options->_has_bits_).has_bits_[0] & 2) != 0) {
        re2::RE2::RE2(&re.re2_,(options->source_filter_).ptr_);
        if (re.re2_.error_code_ != NoError) {
          Throw("invalid regex for source_filter",0x90c);
        }
        re2::RE2::~RE2(&re.re2_);
      }
      verbose_level = options->verbose_level_;
      if ((options->data_source_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        if (((options->_has_bits_).has_bits_[0] & 1) != 0) {
          psVar2 = (options->disassemble_function_).ptr_;
          function._M_str = (psVar2->_M_dataplus)._M_p;
          function._M_len = psVar2->_M_string_length;
          Bloaty::DisassembleFunction(&bloaty,function,options,output);
        }
      }
      else {
        Bloaty::ScanAndRollup(&bloaty,options,output);
      }
      Bloaty::~Bloaty(&bloaty);
      return;
    }
    iVar4 = 0x8ee;
    str = "max_rows_per_level must be at least 1";
  }
  Throw(str,iVar4);
}

Assistant:

void BloatyDoMain(const Options& options, const InputFileFactory& file_factory,
                  RollupOutput* output) {
  bloaty::Bloaty bloaty(file_factory, options);

  if (options.filename_size() == 0) {
    THROW("must specify at least one file");
  }

  if (options.max_rows_per_level() < 1) {
    THROW("max_rows_per_level must be at least 1");
  }

  for (auto& filename : options.filename()) {
    bloaty.AddFilename(filename, false);
  }

  for (auto& base_filename : options.base_filename()) {
    bloaty.AddFilename(base_filename, true);
  }

  for (auto& debug_filename : options.debug_filename()) {
    bloaty.AddDebugFilename(debug_filename);
  }

  for (auto& sourcemap : options.source_map()) {
    bloaty.AddSourceMapFilename(sourcemap);
  }

  for (const auto& custom_data_source : options.custom_data_source()) {
    bloaty.DefineCustomDataSource(custom_data_source);
  }

  for (const auto& data_source : options.data_source()) {
    bloaty.AddDataSource(data_source);
  }

  if (options.has_source_filter()) {
    ReImpl re(options.source_filter());
    if (!re.ok()) {
      THROW("invalid regex for source_filter");
    }
  }

  verbose_level = options.verbose_level();

  if (options.data_source_size() > 0) {
    bloaty.ScanAndRollup(options, output);
  } else if (options.has_disassemble_function()) {
    bloaty.DisassembleFunction(options.disassemble_function(), options, output);
  }
}